

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckColor(BlitTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  undefined8 *puVar2;
  GLfloat (*paGVar3) [4];
  ulong uVar4;
  long lVar5;
  long lVar6;
  GLfloat (*paaGVar7) [3] [4];
  undefined8 *puVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  GLfloat color [2] [3] [4];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  BlitTest *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1b8 = this;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar8 = &local_218;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8 = 0;
  uStack_1e0 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,3,2,0x1908,0x1406,puVar8);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb5b);
  this_00 = (ostringstream *)(local_1b0 + 8);
  paaGVar7 = CheckColor::reference;
  bVar10 = false;
  lVar5 = 0;
  do {
    uVar4 = 0;
    bVar9 = false;
    puVar2 = puVar8;
    paGVar3 = *paaGVar7;
    do {
      lVar6 = 0;
      do {
        fVar11 = (*(GLfloat (*) [4])*paGVar3)[lVar6] - *(float *)((long)puVar2 + lVar6 * 4);
        fVar12 = -fVar11;
        if (-fVar11 <= fVar11) {
          fVar12 = fVar11;
        }
        if (0.015625 < fVar12) {
          local_1b0._0_8_ = ((local_1b8->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Blitted framebuffer color buffer contains [[",0x2c);
          std::ostream::_M_insert<double>((double)(float)local_218);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_218._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_210);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_210._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_208._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_200);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_200._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_1f8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1f8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1f0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1f0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"],\n[",4);
          std::ostream::_M_insert<double>((double)(float)local_1e8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1e8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1e0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1e0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_1d8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1d8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1d0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>((double)(float)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)local_1c8._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)(float)uStack_1c0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>((double)uStack_1c0._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]], but\n",8);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"],\n[",4);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], [",4);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(0.0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
          std::ostream::_M_insert<double>(1.0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"]] was expected.\n",0x11);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_138);
          if (!bVar9) {
            return bVar10;
          }
          goto LAB_00a9efb5;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      bVar9 = 1 < uVar4;
      uVar4 = uVar4 + 1;
      paGVar3 = paGVar3 + 1;
      puVar2 = puVar2 + 2;
    } while (uVar4 != 3);
LAB_00a9efb5:
    paaGVar7 = (GLfloat (*) [3] [4])((long)paaGVar7 + 0x30);
    puVar8 = puVar8 + 6;
    bVar10 = lVar5 != 0;
    lVar5 = lVar5 + 1;
    if (bVar10) {
      return bVar10;
    }
  } while( true );
}

Assistant:

bool BlitTest::CheckColor()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3][4] = {
		{ { 1.f, 0.f, 0.f, 1.f }, { 0.f, 1.f, 0.f, 1.f }, { 0.f, 0.f, 1.f, 1.f } },
		{ { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f } }
	};

	/* Copy buffer. */
	glw::GLfloat color[2][3][4] = { { { 0 } } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_RGBA, GL_FLOAT, color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			for (glw::GLuint k = 0; k < 4; ++k)
			{
				if (de::abs(reference[j][i][k] - color[j][i][k]) > (1.f / 64.f) /* Precision. */)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Blitted framebuffer color buffer contains [[" << color[0][0][0]
						<< ", " << color[0][0][1] << ", " << color[0][0][2] << ", " << color[0][0][3] << "], ["
						<< color[0][1][0] << ", " << color[0][1][1] << ", " << color[0][1][2] << ", " << color[0][1][3]
						<< "], [" << color[0][2][0] << ", " << color[0][2][1] << ", " << color[0][2][2] << ", "
						<< color[0][2][3] << "],\n[" << color[1][0][0] << ", " << color[1][0][1] << ", "
						<< color[1][0][2] << ", " << color[1][0][3] << "], [" << color[1][1][0] << ", "
						<< color[1][1][1] << ", " << color[1][1][2] << ", " << color[1][1][3] << "], ["
						<< color[1][2][0] << ", " << color[1][2][1] << ", " << color[1][2][2] << ", " << color[1][2][3]
						<< "]], but\n"
						<< reference[0][0][0] << ", " << reference[0][0][1] << ", " << reference[0][0][2] << ", "
						<< reference[0][0][3] << "], [" << reference[0][1][0] << ", " << reference[0][1][1] << ", "
						<< reference[0][1][2] << ", " << reference[0][1][3] << "], [" << reference[0][2][0] << ", "
						<< reference[0][2][1] << ", " << reference[0][2][2] << ", " << reference[0][2][3] << "],\n["
						<< reference[1][0][0] << ", " << reference[1][0][1] << ", " << reference[1][0][2] << ", "
						<< reference[1][0][3] << "], [" << reference[1][1][0] << ", " << reference[1][1][1] << ", "
						<< reference[1][1][2] << ", " << reference[1][1][3] << "], [" << reference[1][2][0] << ", "
						<< reference[1][2][1] << ", " << reference[1][2][2] << ", " << reference[1][2][3]
						<< "]] was expected.\n"
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}